

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::integer_to_string<unsigned_int>
                   (char_t *begin,char_t *end,uint value,bool negative)

{
  char *pcVar1;
  uint local_30;
  uint local_2c;
  char *pcStack_28;
  uint rest;
  char_t *result;
  bool negative_local;
  uint value_local;
  char_t *end_local;
  char_t *begin_local;
  
  local_30 = value;
  if (negative) {
    local_30 = -value;
  }
  local_2c = local_30;
  pcStack_28 = end + -1;
  do {
    pcVar1 = pcStack_28 + -1;
    *pcStack_28 = (char)((ulong)local_2c % 10) + '0';
    local_2c = local_2c / 10;
    pcStack_28 = pcVar1;
  } while (local_2c != 0);
  if (pcVar1 < begin) {
    __assert_fail("result >= begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1231,
                  "char_t *pugi::impl::(anonymous namespace)::integer_to_string(char_t *, char_t *, U, bool) [U = unsigned int]"
                 );
  }
  *pcVar1 = '-';
  return pcVar1 + (int)(uint)((negative ^ 0xffU) & 1);
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW char_t* integer_to_string(char_t* begin, char_t* end, U value, bool negative)
	{
		char_t* result = end - 1;
		U rest = negative ? 0 - value : value;

		do
		{
			*result-- = static_cast<char_t>('0' + (rest % 10));
			rest /= 10;
		}
		while (rest);

		assert(result >= begin);
		(void)begin;

		*result = '-';

		return result + !negative;
	}